

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

FieldDescriptor *
google::protobuf::compiler::js::anon_unknown_0::MapFieldKey(FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *this;
  FieldDescriptor *pFVar2;
  FieldDescriptor *local_18;
  _func_void_FieldDescriptor_ptr *local_10;
  
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_10 = FieldDescriptor::TypeOnceInit;
    local_18 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_10,&local_18);
  }
  if (field[2] == (FieldDescriptor)0xb) {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    if (bVar1) {
      this = FieldDescriptor::message_type(field);
      pFVar2 = Descriptor::FindFieldByNumber(this,1);
      return pFVar2;
    }
  }
  __assert_fail("field->is_map()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                ,0x4e7,
                "const FieldDescriptor *google::protobuf::compiler::js::(anonymous namespace)::MapFieldKey(const FieldDescriptor *)"
               );
}

Assistant:

const FieldDescriptor* MapFieldKey(const FieldDescriptor* field) {
  assert(field->is_map());
  return field->message_type()->FindFieldByNumber(kMapKeyField);
}